

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O3

ngx_int_t ngx_http_do_read_client_request_body(ngx_http_request_t *r)

{
  u_char **ppuVar1;
  ngx_connection_t *pnVar2;
  ngx_http_request_body_t *pnVar3;
  ngx_buf_t *pnVar4;
  ngx_int_t nVar5;
  u_char *puVar6;
  ngx_int_t nVar7;
  u_char *puVar8;
  u_char *puVar9;
  ngx_chain_t *in;
  ngx_event_t *pnVar10;
  long lVar11;
  u_char *puVar12;
  undefined1 local_40 [8];
  ngx_chain_t out;
  
  pnVar2 = r->connection;
  pnVar3 = r->request_body;
  if ((pnVar2->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar2->log,0,"http read client request body");
  }
  do {
    pnVar4 = pnVar3->buf;
    puVar6 = pnVar4->last;
    puVar8 = pnVar4->end;
    do {
      puVar12 = pnVar4->pos;
      if (puVar6 == puVar8) {
        if (pnVar4->pos == puVar8) {
          in = (ngx_chain_t *)0x0;
        }
        else {
          out.buf = (ngx_buf_t *)0x0;
          in = (ngx_chain_t *)local_40;
          local_40 = (undefined1  [8])pnVar4;
        }
        nVar5 = ngx_http_request_body_filter(r,in);
        if (nVar5 != 0) {
          return nVar5;
        }
        if (pnVar3->busy != (ngx_chain_t *)0x0) {
          if ((r->field_0x467 & 4) == 0) {
            return 500;
          }
          pnVar10 = pnVar2->read;
          if ((pnVar10->field_0x9 & 8) != 0) {
            if ((pnVar10->log->log_level & 0x80) != 0) {
              ngx_log_error_core(8,pnVar10->log,0,"event timer del: %d: %M",
                                 (ulong)*(uint *)((long)pnVar10->data + 0x18),(pnVar10->timer).key);
            }
            ngx_rbtree_delete(&ngx_event_timer_rbtree,&pnVar10->timer);
            (pnVar10->timer).left = (ngx_rbtree_node_t *)0x0;
            (pnVar10->timer).right = (ngx_rbtree_node_t *)0x0;
            (pnVar10->timer).parent = (ngx_rbtree_node_t *)0x0;
            pnVar10->field_0x9 = pnVar10->field_0x9 & 0xf7;
            pnVar10 = pnVar2->read;
          }
          goto LAB_00148e29;
        }
        pnVar4 = pnVar3->buf;
        puVar6 = pnVar4->start;
        puVar8 = pnVar4->end;
        pnVar4->pos = puVar6;
        pnVar4->last = puVar6;
        puVar12 = puVar6;
      }
      puVar12 = puVar12 + (pnVar3->rest - (long)puVar6);
      puVar9 = puVar8 + -(long)puVar6;
      if ((long)puVar12 <= (long)(puVar8 + -(long)puVar6)) {
        puVar9 = puVar12;
      }
      puVar6 = (u_char *)(*pnVar2->recv)(pnVar2,puVar6,(size_t)puVar9);
      if ((pnVar2->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar2->log,0,"http client request body recv %z",puVar6);
      }
      if (puVar6 == (u_char *)0x0) {
        if (6 < pnVar2->log->log_level) {
          ngx_log_error_core(7,pnVar2->log,0,"client prematurely closed connection");
        }
LAB_00148d9f:
        pnVar2->field_0xd9 = pnVar2->field_0xd9 | 0x10;
        return 400;
      }
      if (puVar6 == (u_char *)0xfffffffffffffffe) {
        lVar11 = pnVar3->rest;
        break;
      }
      if (puVar6 + 1 < (u_char *)0x2) goto LAB_00148d9f;
      pnVar4 = pnVar3->buf;
      ppuVar1 = &pnVar4->last;
      *ppuVar1 = *ppuVar1 + (long)puVar6;
      r->request_length = (off_t)(puVar6 + r->request_length);
      if (puVar6 == puVar12) {
        out.buf = (ngx_buf_t *)0x0;
        local_40 = (undefined1  [8])pnVar4;
        nVar5 = ngx_http_request_body_filter(r,(ngx_chain_t *)local_40);
        if (nVar5 != 0) {
          return nVar5;
        }
      }
      lVar11 = pnVar3->rest;
      if (lVar11 == 0) {
        lVar11 = 0;
        break;
      }
      pnVar4 = pnVar3->buf;
      puVar6 = pnVar4->last;
      puVar8 = pnVar4->end;
    } while (puVar8 <= puVar6);
    if ((pnVar2->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar2->log,0,"http client request body rest %O");
      lVar11 = pnVar3->rest;
    }
    pnVar10 = pnVar2->read;
    if (lVar11 == 0) {
      if ((*(uint *)&pnVar10->field_0x8 >> 0xb & 1) != 0) {
        ngx_event_del_timer(pnVar10);
      }
      if ((r->field_0x467 & 4) == 0) {
        r->read_event_handler = ngx_http_block_reading;
        (*pnVar3->post_handler)(r);
      }
      return 0;
    }
    if ((*(uint *)&pnVar10->field_0x8 & 0x20) == 0) {
      if (((r->field_0x467 & 4) != 0) && (pnVar4 = pnVar3->buf, pnVar4->pos != pnVar4->last)) {
        out.buf = (ngx_buf_t *)0x0;
        local_40 = (undefined1  [8])pnVar4;
        nVar5 = ngx_http_request_body_filter(r,(ngx_chain_t *)local_40);
        if (nVar5 != 0) {
          return nVar5;
        }
        pnVar10 = pnVar2->read;
      }
      ngx_event_add_timer(pnVar10,*(ngx_msec_t *)
                                   ((long)r->loc_conf[ngx_http_core_module.ctx_index] + 0x100));
      pnVar10 = pnVar2->read;
LAB_00148e29:
      nVar7 = ngx_handle_read_event(pnVar10,0);
      nVar5 = 500;
      if (nVar7 == 0) {
        nVar5 = -2;
      }
      return nVar5;
    }
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_do_read_client_request_body(ngx_http_request_t *r)
{
    off_t                      rest;
    size_t                     size;
    ssize_t                    n;
    ngx_int_t                  rc;
    ngx_chain_t                out;
    ngx_connection_t          *c;
    ngx_http_request_body_t   *rb;
    ngx_http_core_loc_conf_t  *clcf;

    c = r->connection;
    rb = r->request_body;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http read client request body");

    for ( ;; ) {
        for ( ;; ) {
            if (rb->buf->last == rb->buf->end) {

                if (rb->buf->pos != rb->buf->last) {

                    /* pass buffer to request body filter chain */

                    out.buf = rb->buf;
                    out.next = NULL;

                    rc = ngx_http_request_body_filter(r, &out);

                    if (rc != NGX_OK) {
                        return rc;
                    }

                } else {

                    /* update chains */

                    rc = ngx_http_request_body_filter(r, NULL);

                    if (rc != NGX_OK) {
                        return rc;
                    }
                }

                if (rb->busy != NULL) {
                    if (r->request_body_no_buffering) {
                        if (c->read->timer_set) {
                            ngx_del_timer(c->read);
                        }

                        if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
                            return NGX_HTTP_INTERNAL_SERVER_ERROR;
                        }

                        return NGX_AGAIN;
                    }

                    return NGX_HTTP_INTERNAL_SERVER_ERROR;
                }

                rb->buf->pos = rb->buf->start;
                rb->buf->last = rb->buf->start;
            }

            size = rb->buf->end - rb->buf->last;
            rest = rb->rest - (rb->buf->last - rb->buf->pos);

            if ((off_t) size > rest) {
                size = (size_t) rest;
            }

            n = c->recv(c, rb->buf->last, size);

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, c->log, 0,
                           "http client request body recv %z", n);

            if (n == NGX_AGAIN) {
                break;
            }

            if (n == 0) {
                ngx_log_error(NGX_LOG_INFO, c->log, 0,
                              "client prematurely closed connection");
            }

            if (n == 0 || n == NGX_ERROR) {
                c->error = 1;
                return NGX_HTTP_BAD_REQUEST;
            }

            rb->buf->last += n;
            r->request_length += n;

            if (n == rest) {
                /* pass buffer to request body filter chain */

                out.buf = rb->buf;
                out.next = NULL;

                rc = ngx_http_request_body_filter(r, &out);

                if (rc != NGX_OK) {
                    return rc;
                }
            }

            if (rb->rest == 0) {
                break;
            }

            if (rb->buf->last < rb->buf->end) {
                break;
            }
        }

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, c->log, 0,
                       "http client request body rest %O", rb->rest);

        if (rb->rest == 0) {
            break;
        }

        if (!c->read->ready) {

            if (r->request_body_no_buffering
                && rb->buf->pos != rb->buf->last)
            {
                /* pass buffer to request body filter chain */

                out.buf = rb->buf;
                out.next = NULL;

                rc = ngx_http_request_body_filter(r, &out);

                if (rc != NGX_OK) {
                    return rc;
                }
            }

            clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);
            ngx_add_timer(c->read, clcf->client_body_timeout);

            if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            return NGX_AGAIN;
        }
    }

    if (c->read->timer_set) {
        ngx_del_timer(c->read);
    }

    if (!r->request_body_no_buffering) {
        r->read_event_handler = ngx_http_block_reading;
        rb->post_handler(r);
    }

    return NGX_OK;
}